

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall glu::TextureBuffer::upload(TextureBuffer *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar4;
  void *pvVar5;
  Functions *gl;
  TextureBuffer *this_local;
  long lVar3;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x40))(0x8c2a,this->m_glBuffer);
  pcVar1 = *(code **)(lVar3 + 0x150);
  sVar4 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::size(&this->m_refBuffer);
  pvVar5 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(&this->m_refBuffer);
  (*pcVar1)(0x8c2a,(long)(int)sVar4,pvVar5,0x88e4);
  (**(code **)(lVar3 + 0x40))(0x8c2a,0);
  err = (**(code **)(lVar3 + 0x800))();
  checkError(err,"Failed to upload buffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x3af);
  return;
}

Assistant:

void TextureBuffer::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	gl.bindBuffer(GL_TEXTURE_BUFFER, m_glBuffer);
	gl.bufferData(GL_TEXTURE_BUFFER, (glw::GLsizei)m_refBuffer.size(), m_refBuffer.getPtr(), GL_STATIC_DRAW);
	gl.bindBuffer(GL_TEXTURE_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload buffer");
}